

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.c
# Opt level: O0

void * epoll_init(event_base *base)

{
  int iVar1;
  int *piVar2;
  eventop *peVar3;
  char *pcVar4;
  undefined1 local_38 [8];
  epoll_event epev;
  int fd;
  epollop *epollop;
  int epfd;
  event_base *base_local;
  
  epollop._4_4_ = epoll_create1(0x80000);
  if (epollop._4_4_ == -1) {
    epollop._4_4_ = epoll_create(32000);
    if (epollop._4_4_ == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 0x26) {
        event_warn("epoll_create");
      }
      return (void *)0x0;
    }
    evutil_make_socket_closeonexec(epollop._4_4_);
  }
  register0x00000000 = (event_base *)event_mm_calloc_(1,0x18);
  if (register0x00000000 == (event_base *)0x0) {
    close(epollop._4_4_);
    base_local = (event_base *)0x0;
  }
  else {
    *(int *)((long)&register0x00000000->evbase + 4) = epollop._4_4_;
    peVar3 = (eventop *)event_mm_calloc_(0x20,0xc);
    stack0xffffffffffffffd8->evsel = peVar3;
    if (stack0xffffffffffffffd8->evsel == (eventop *)0x0) {
      event_mm_free_(stack0xffffffffffffffd8);
      close(epollop._4_4_);
      base_local = (event_base *)0x0;
    }
    else {
      *(undefined4 *)&stack0xffffffffffffffd8->evbase = 0x20;
      if (((base->flags & EVENT_BASE_FLAG_EPOLL_USE_CHANGELIST) != 0) ||
         (((base->flags & EVENT_BASE_FLAG_IGNORE_ENV) == 0 &&
          (pcVar4 = evutil_getenv_("EVENT_EPOLL_USE_CHANGELIST"), pcVar4 != (char *)0x0)))) {
        base->evsel = &epollops_changelist;
      }
      if (((base->flags & EVENT_BASE_FLAG_PRECISE_TIMER) == 0) ||
         ((base->monotonic_timer).monotonic_clock != 1)) {
        *(undefined4 *)&(stack0xffffffffffffffd8->changelist).changes = 0xffffffff;
      }
      else {
        epev.data.fd = timerfd_create(1,0x80800);
        *(undefined4 *)&(stack0xffffffffffffffd8->changelist).changes = epev.data.fd;
        if (*(int *)&(stack0xffffffffffffffd8->changelist).changes < 0) {
          piVar2 = __errno_location();
          if ((*piVar2 != 0x16) && (piVar2 = __errno_location(), *piVar2 != 0x26)) {
            event_warn("timerfd_create");
          }
          *(undefined4 *)&(stack0xffffffffffffffd8->changelist).changes = 0xffffffff;
        }
        else {
          memset(local_38,0,0xc);
          local_38._4_4_ = *(undefined4 *)&(stack0xffffffffffffffd8->changelist).changes;
          local_38._0_4_ = 1;
          iVar1 = epoll_ctl(*(int *)((long)&stack0xffffffffffffffd8->evbase + 4),1,epev.data.fd,
                            (epoll_event *)local_38);
          if (iVar1 < 0) {
            event_warn("epoll_ctl(timerfd)");
            close(epev.data.fd);
            *(undefined4 *)&(stack0xffffffffffffffd8->changelist).changes = 0xffffffff;
          }
        }
      }
      evsig_init_(base);
      base_local = stack0xffffffffffffffd8;
    }
  }
  return base_local;
}

Assistant:

static void *
epoll_init(struct event_base *base)
{
	int epfd = -1;
	struct epollop *epollop;

#ifdef EVENT__HAVE_EPOLL_CREATE1
	/* First, try the shiny new epoll_create1 interface, if we have it. */
	epfd = epoll_create1(EPOLL_CLOEXEC);
#endif
	if (epfd == -1) {
		/* Initialize the kernel queue using the old interface.  (The
		size field is ignored   since 2.6.8.) */
		if ((epfd = epoll_create(32000)) == -1) {
			if (errno != ENOSYS)
				event_warn("epoll_create");
			return (NULL);
		}
		evutil_make_socket_closeonexec(epfd);
	}

	if (!(epollop = mm_calloc(1, sizeof(struct epollop)))) {
		close(epfd);
		return (NULL);
	}

	epollop->epfd = epfd;

	/* Initialize fields */
	epollop->events = mm_calloc(INITIAL_NEVENT, sizeof(struct epoll_event));
	if (epollop->events == NULL) {
		mm_free(epollop);
		close(epfd);
		return (NULL);
	}
	epollop->nevents = INITIAL_NEVENT;

	if ((base->flags & EVENT_BASE_FLAG_EPOLL_USE_CHANGELIST) != 0 ||
	    ((base->flags & EVENT_BASE_FLAG_IGNORE_ENV) == 0 &&
		evutil_getenv_("EVENT_EPOLL_USE_CHANGELIST") != NULL)) {

		base->evsel = &epollops_changelist;
	}

#ifdef USING_TIMERFD
	/*
	  The epoll interface ordinarily gives us one-millisecond precision,
	  so on Linux it makes perfect sense to use the CLOCK_MONOTONIC_COARSE
	  timer.  But when the user has set the new PRECISE_TIMER flag for an
	  event_base, we can try to use timerfd to give them finer granularity.
	*/
	if ((base->flags & EVENT_BASE_FLAG_PRECISE_TIMER) &&
	    base->monotonic_timer.monotonic_clock == CLOCK_MONOTONIC) {
		int fd;
		fd = epollop->timerfd = timerfd_create(CLOCK_MONOTONIC, TFD_NONBLOCK|TFD_CLOEXEC);
		if (epollop->timerfd >= 0) {
			struct epoll_event epev;
			memset(&epev, 0, sizeof(epev));
			epev.data.fd = epollop->timerfd;
			epev.events = EPOLLIN;
			if (epoll_ctl(epollop->epfd, EPOLL_CTL_ADD, fd, &epev) < 0) {
				event_warn("epoll_ctl(timerfd)");
				close(fd);
				epollop->timerfd = -1;
			}
		} else {
			if (errno != EINVAL && errno != ENOSYS) {
				/* These errors probably mean that we were
				 * compiled with timerfd/TFD_* support, but
				 * we're running on a kernel that lacks those.
				 */
				event_warn("timerfd_create");
			}
			epollop->timerfd = -1;
		}
	} else {
		epollop->timerfd = -1;
	}
#endif

	evsig_init_(base);

	return (epollop);
}